

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void P_SetSectorFriction(int tag,int amount,bool alterFlag)

{
  bool bVar1;
  sector_t *psVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  FSectorTagIterator itr;
  double local_48;
  FSectorTagIterator local_40;
  double local_38;
  undefined8 uStack_30;
  
  iVar3 = amount * 0x1eb8;
  iVar5 = iVar3 + 0x7f;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  dVar6 = (double)((iVar5 >> 7) + 0xd001) * 1.52587890625e-05;
  local_38 = 1.0;
  if (dVar6 <= 1.0) {
    local_38 = dVar6;
  }
  local_38 = (double)(-(ulong)(0.0 < dVar6) & (ulong)local_38);
  uStack_30 = 0;
  if (0.90625 <= local_38) {
    local_48 = ((65682.0 - local_38 * 65536.0) * 1024.0) / 4352.0 + 568.0;
  }
  else {
    local_48 = (local_38 * 65536.0 + -56116.0) * 10.0 * 0.0078125;
  }
  if (tag == 0) {
    local_40.start = 0;
  }
  else {
    local_40.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_40.searchtag = tag;
  uVar4 = FSectorTagIterator::Next(&local_40);
  if (-1 < (int)uVar4) {
    dVar6 = 0.00048828125;
    if (0.00048828125 <= local_48 * 1.52587890625e-05) {
      dVar6 = local_48 * 1.52587890625e-05;
    }
    bVar1 = local_38 != 0.90625;
    do {
      psVar2 = sectors;
      sectors[uVar4].friction = local_38;
      psVar2[uVar4].movefactor = dVar6;
      if (alterFlag) {
        psVar2[uVar4].Flags = psVar2[uVar4].Flags & 0xffffffef | (-(uint)bVar1 & 1) << 4;
      }
      uVar4 = FSectorTagIterator::Next(&local_40);
    } while (-1 < (int)uVar4);
  }
  return;
}

Assistant:

void P_SetSectorFriction (int tag, int amount, bool alterFlag)
{
	int s;
	double friction, movefactor;

	// An amount of 100 should result in a friction of
	// ORIG_FRICTION (0xE800)
	friction = ((0x1EB8 * amount) / 0x80 + 0xD001) / 65536.;

	// killough 8/28/98: prevent odd situations
	friction = clamp(friction, 0., 1.);

	// The following check might seem odd. At the time of movement,
	// the move distance is multiplied by 'friction/0x10000', so a
	// higher friction value actually means 'less friction'.
	movefactor = FrictionToMoveFactor(friction);

	FSectorTagIterator itr(tag);
	while ((s = itr.Next()) >= 0)
	{
		// killough 8/28/98:
		//
		// Instead of spawning thinkers, which are slow and expensive,
		// modify the sector's own friction values. Friction should be
		// a property of sectors, not objects which reside inside them.
		// Original code scanned every object in every friction sector
		// on every tic, adjusting its friction, putting unnecessary
		// drag on CPU. New code adjusts friction of sector only once
		// at level startup, and then uses this friction value.

		sectors[s].friction = friction;
		sectors[s].movefactor = movefactor;
		if (alterFlag)
		{
			// When used inside a script, the sectors' friction flags
			// can be enabled and disabled at will.
			if (friction == ORIG_FRICTION)
			{
				sectors[s].Flags &= ~SECF_FRICTION;
			}
			else
			{
				sectors[s].Flags |= SECF_FRICTION;
			}
		}
	}
}